

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O1

tnt_error tnt_io_xbufmax(tnt_stream_net *s,int opt,int min)

{
  int iVar1;
  tnt_error in_EAX;
  int iVar2;
  int iVar3;
  uint local_34 [2];
  uint avg;
  
  iVar2 = 0x4000;
  if (min != 0) {
    iVar2 = min;
  }
  if (iVar2 < 0x8000001) {
    iVar3 = 0x8000000;
    do {
      local_34[0] = (uint)(iVar2 + iVar3) >> 1;
      in_EAX = setsockopt(s->fd,1,opt,local_34,4);
      iVar1 = local_34[0] - 1;
      if (in_EAX == TNT_EOK) {
        iVar1 = iVar3;
        iVar2 = local_34[0] + 1;
      }
      iVar3 = iVar1;
    } while (iVar2 <= iVar3);
  }
  return in_EAX;
}

Assistant:

static enum tnt_error tnt_io_xbufmax(struct tnt_stream_net *s, int opt, int min) {
	int max = 128 * 1024 * 1024;
	if (min == 0)
		min = 16384;
	unsigned int avg = 0;
	while (min <= max) {
		avg = ((unsigned int)(min + max)) / 2;
		if (setsockopt(s->fd, SOL_SOCKET, opt, &avg, sizeof(avg)) == 0)
			min = avg + 1;
		else
			max = avg - 1;
	}
	return TNT_EOK;
}